

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O2

void __thiscall
agge::tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
          (blender<unsigned_char,_unsigned_char> *this,uchar *pixels,int x,int y,uint length,
          cover_type *covers)

{
  long lVar1;
  allocator local_69;
  uint local_68 [2];
  LocationInfo local_60;
  string local_38;
  
  local_68[1] = 0;
  local_68[0] = length;
  std::__cxx11::string::string
            ((string *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/mocks.h",
             &local_69);
  ut::LocationInfo::LocationInfo(&local_60,&local_38,0x101);
  ut::are_not_equal<unsigned_int,unsigned_int>(local_68 + 1,local_68,&local_60);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  for (lVar1 = 0; local_68[0] != (uint)lVar1; lVar1 = lVar1 + 1) {
    pixels[lVar1] = covers[lVar1];
  }
  return;
}

Assistant:

void operator ()(PixelT *pixels, int x, int y, unsigned int length, const cover_type *covers) const
				{
					assert_not_equal(0u, length);

					int offset = sizeof(cover_type) * 8;
					int mask_x = 0x000000FF << offset;
					int mask_y = 0x0000FF00 << offset;

					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ ((x << offset) & mask_x)
							+ ((y << (offset + 8)) & mask_y));
				}